

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O3

void av1_enc_build_inter_predictor
               (AV1_COMMON *cm,MACROBLOCKD *xd,int mi_row,int mi_col,BUFFER_SET *ctx,
               BLOCK_SIZE bsize,int plane_from,int plane_to)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  PREDICTION_MODE PVar4;
  BLOCK_SIZE BVar5;
  int dst_stride;
  uint uVar6;
  MB_MODE_INFO *pMVar7;
  uint8_t *dst;
  WarpedMotionParams *pWVar8;
  MB_MODE_INFO *pMVar9;
  RefCntBuffer *pRVar10;
  ushort uVar11;
  macroblockd_plane *pmVar12;
  macroblockd_plane *pmVar13;
  int iVar14;
  char cVar15;
  int plane;
  int iVar16;
  MB_MODE_INFO **ppMVar17;
  byte bVar18;
  uint uVar19;
  byte bVar20;
  long lVar21;
  buf_2d *pbVar22;
  ulong uVar23;
  InterpFilterParams *pIVar24;
  bool bVar25;
  long lVar26;
  int col;
  uint uVar27;
  int ref;
  long lVar28;
  int x;
  long lVar29;
  ulong uVar30;
  long lVar31;
  bool bVar32;
  bool bVar33;
  macroblockd_plane *pd;
  int is_global [2];
  WarpTypesAllowed warp_types;
  BUFFER_SET default_ctx;
  BUFFER_SET *local_170;
  uint local_158 [2];
  WarpTypesAllowed local_150;
  undefined1 local_148 [16];
  uint8_t *local_138;
  int local_130;
  int local_12c;
  int local_128;
  int local_118;
  CONV_BUF_TYPE *local_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  uint local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  InterpFilterParams *local_e8;
  InterpFilterParams *local_e0;
  uint local_d8;
  uint local_d4;
  int local_d0;
  int local_cc;
  uint8_t *local_c8;
  uint8_t *puStack_c0;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  undefined4 uStack_ac;
  int local_a8;
  int local_a4;
  scale_factors *local_a0;
  int local_98;
  uint local_94;
  uint8_t *local_90;
  undefined8 uStack_88;
  BLOCK_SIZE local_80;
  uint local_7c;
  int local_78;
  int local_74;
  long local_70;
  ulong local_68;
  macroblockd_plane *local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  scale_factors *local_40;
  scale_factors *local_38;
  
  if (plane_from <= plane_to) {
    local_60 = xd->plane;
    local_38 = &cm->sf_identity;
    local_40 = cm->ref_scale_factors;
    lVar31 = (long)plane_from;
    lVar29 = lVar31 * 0xa30;
    local_170 = ctx;
    do {
      pmVar13 = local_60;
      if ((lVar31 != 0) && (xd->is_chroma_ref != true)) {
        return;
      }
      pMVar7 = *xd->mi;
      bVar1 = local_60[lVar31].width;
      bVar2 = local_60[lVar31].height;
      uVar30 = (ulong)pMVar7->bsize;
      cVar15 = (char)*(undefined2 *)&pMVar7->field_0xa7;
      plane = (int)lVar31;
      if (cVar15 < '\0') {
LAB_00228504:
        cVar3 = pMVar7->ref_frame[1];
        pmVar12 = local_60 + lVar31;
        dst = local_60[lVar31].dst.buf;
        local_158[0] = 0;
        local_158[1] = 0;
        pWVar8 = xd->global_motion;
        PVar4 = pMVar7->mode;
        bVar18 = block_size_high[uVar30];
        if (block_size_wide[uVar30] < block_size_high[uVar30]) {
          bVar18 = block_size_wide[uVar30];
        }
        lVar26 = (ulong)('\0' < cVar3) + 1;
        lVar21 = 0;
        do {
          local_158[lVar21] =
               (uint)((7 < bVar18 && (PVar4 - 0xf & 0xf7) == 0) &&
                     1 < pWVar8[pMVar7->ref_frame[lVar21]].wmtype);
          lVar21 = lVar21 + 1;
        } while (lVar26 != lVar21);
        iVar16 = pmVar13[lVar31].subsampling_x;
        iVar14 = pmVar13[lVar31].subsampling_y;
        lVar28 = 0;
        lVar21 = lVar29;
        do {
          local_a0 = local_38;
          if (-1 < cVar15) {
            local_a0 = xd->block_ref_scale_factors[lVar28];
          }
          pbVar22 = (buf_2d *)((long)&xd->plane[0].pre[0].buf + lVar21);
          if (cVar15 < '\0') {
            pbVar22 = &pmVar12->dst;
          }
          uVar19 = pMVar7->mv[lVar28].as_int;
          local_150.global_warp_allowed = local_158[lVar28];
          local_150.local_warp_allowed = (int)(pMVar7->motion_mode == '\x02');
          local_a8 = pmVar13[lVar31].subsampling_x;
          local_a4 = pmVar13[lVar31].subsampling_y;
          local_98 = xd->bd;
          local_94 = (uint)xd->cur_buf->flags >> 3 & 1;
          uVar11 = *(ushort *)&pMVar7->field_0xa7 >> 7;
          local_7c = uVar11 & 1;
          uVar27 = (pMVar7->interp_filters).as_int;
          local_148._0_8_ = (uint8_t *)0x0;
          local_78 = (0x120U >> ((byte)local_a4 & 0x1f)) * -0x400 + 0x1000;
          local_74 = (0x120U >> ((byte)local_a8 & 0x1f)) * -0x400 + 0x1000;
          local_e8 = &av1_intrabc_filter_params;
          local_e0 = &av1_intrabc_filter_params;
          if ((uVar11 & 1) == 0) {
            uVar23 = (ulong)(uVar27 >> 0xc & 0xff0);
            pIVar24 = (InterpFilterParams *)
                      ((long)&av1_interp_filter_params_list[0].filter_ptr + uVar23);
            local_e8 = (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar23);
            if ((char)(uVar27 >> 0x10) == '\x04') {
              local_e8 = pIVar24;
            }
            if (4 < bVar1) {
              local_e8 = pIVar24;
            }
            uVar23 = (ulong)((uVar27 & 0xff) << 4);
            pIVar24 = (InterpFilterParams *)
                      ((long)&av1_interp_filter_params_list[0].filter_ptr + uVar23);
            local_e0 = (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar23);
            if ((char)uVar27 == '\x04') {
              local_e0 = pIVar24;
            }
            if (4 < bVar2) {
              local_e0 = pIVar24;
            }
          }
          local_c8 = pbVar22->buf;
          puStack_c0 = pbVar22->buf0;
          local_b8 = pbVar22->width;
          iStack_b4 = pbVar22->height;
          iStack_b0 = pbVar22->stride;
          uStack_ac = *(undefined4 *)&pbVar22->field_0x1c;
          if (cVar3 < '\x01') {
            local_110 = xd->tmp_conv_dst;
            local_f8 = 0;
            if (local_98 < 0xb) {
              local_104 = 3;
              local_100 = 0xb;
            }
            else {
              local_100 = 0x15 - local_98;
              local_104 = local_98 + -7;
              local_f8 = 0;
            }
          }
          else {
            local_148._0_8_ = (uint8_t *)0x100000000;
            local_104 = local_98 + -7;
            if (local_98 < 0xb) {
              local_104 = 3;
            }
            local_110 = xd->tmp_conv_dst;
            local_100 = 7;
            local_f8 = 1;
          }
          local_108 = 0x80;
          local_f4 = 0;
          local_118 = (int)lVar28;
          local_fc = plane;
          local_d8 = (uint)bVar1;
          local_d4 = (uint)bVar2;
          local_d0 = (int)((mi_row - (uint)(iVar14 != 0 && (0x20005UL >> (uVar30 & 0x3f) & 1) != 0))
                          * 4) >> ((byte)iVar14 & 0x1f);
          local_cc = (int)((mi_col - (uint)(iVar16 != 0 && (0x10003UL >> (uVar30 & 0x3f) & 1) != 0))
                          * 4) >> ((byte)iVar16 & 0x1f);
          av1_dist_wtd_comp_weight_assign
                    (cm,pMVar7,&local_f0,&local_ec,&local_f4,(uint)('\0' < cVar3));
          av1_init_warp_params((InterPredParams *)local_148,&local_150,(int)lVar28,xd,pMVar7);
          if (((pMVar7->interinter_comp).type & 0xfe) == 2) {
            local_80 = pMVar7->bsize;
            uStack_88._0_1_ = (pMVar7->interinter_comp).wedge_index;
            uStack_88._1_1_ = (pMVar7->interinter_comp).wedge_sign;
            uStack_88._2_1_ = (pMVar7->interinter_comp).mask_type;
            uStack_88._3_1_ = (pMVar7->interinter_comp).type;
            uStack_88._4_4_ = *(undefined4 *)&(pMVar7->interinter_comp).field_0xc;
            if (lVar28 == 1) {
              local_118 = 0;
              local_148._4_4_ = MASK_COMP;
            }
            local_90 = xd->seg_mask;
          }
          build_one_inter_predictor
                    (dst,pmVar13[lVar31].dst.stride,(MV *)(ulong)uVar19,
                     (InterPredParams *)(ulong)(uVar19 >> 0x10));
          lVar28 = lVar28 + 1;
          lVar21 = lVar21 + 0x20;
        } while (lVar26 != lVar28);
      }
      else {
        iVar16 = local_60[lVar31].subsampling_y;
        bVar20 = (byte)(0x10003L >> (pMVar7->bsize & 0x3f));
        bVar18 = local_60[lVar31].subsampling_x != 0 & bVar20;
        bVar32 = (0x20005UL >> (uVar30 & 0x3f) & 1) != 0;
        bVar25 = iVar16 != 0 && bVar32;
        if ((bVar18 == 0) && (iVar16 == 0 || !bVar32)) goto LAB_00228504;
        lVar28 = -(ulong)bVar18;
        lVar26 = -(ulong)bVar25;
        ppMVar17 = (MB_MODE_INFO **)((long)xd->mi + (long)xd->mi_stride * 8 * lVar26);
        lVar21 = lVar28;
        do {
          do {
            if (((ppMVar17[lVar21]->field_0xa7 & 0x80) != 0) ||
               (ppMVar17[lVar21]->ref_frame[0] < '\x01')) goto LAB_00228504;
            lVar21 = lVar21 + 1;
          } while (lVar21 != 1);
          ppMVar17 = ppMVar17 + xd->mi_stride;
          bVar32 = lVar26 != 0;
          lVar21 = lVar28;
          lVar26 = lVar26 + 1;
        } while (bVar32);
        bVar32 = iVar16 != 0;
        bVar33 = local_60[lVar31].subsampling_x != 0;
        bVar1 = block_size_wide[uVar30];
        uVar27 = (uint)(block_size_high[uVar30] >> bVar32);
        BVar5 = av1_ss_size_lookup[uVar30][bVar33][bVar32];
        bVar2 = block_size_high[BVar5];
        cVar15 = pMVar7->ref_frame[1];
        bVar20 = bVar20 & bVar33;
        uVar19 = (uint)bVar25;
        iVar16 = -uVar19;
        local_68 = (ulong)(uint)((int)((mi_row - uVar19) * 4) >> bVar32);
        local_48 = (ulong)(uint)((int)((mi_col - (uint)bVar20) * 4) >> bVar33);
        local_50 = (ulong)block_size_wide[BVar5];
        local_58 = (ulong)(lVar31 != 1) * 8 + 0x510;
        local_70 = -(ulong)bVar20;
        uVar19 = 0;
        do {
          iVar14 = (int)local_68;
          uVar30 = 0;
          lVar21 = local_70;
          do {
            pMVar9 = xd->mi[(long)iVar16 * (long)xd->mi_stride + lVar21];
            dst_stride = pmVar13[lVar31].dst.stride;
            pRVar10 = cm->ref_frame_map[cm->remapped_ref_idx[(byte)pMVar9->ref_frame[0] - 1]];
            puStack_c0 = *(uint8_t **)((long)pRVar10->ref_order_hints + local_58 + -8);
            local_a8 = pmVar13[lVar31].subsampling_x;
            local_a4 = pmVar13[lVar31].subsampling_y;
            local_98 = xd->bd;
            uVar6 = (pMVar9->interp_filters).as_int;
            local_d8 = (uint)(bVar1 >> bVar33);
            local_cc = (int)local_48 + (int)uVar30;
            local_94 = (uint)xd->cur_buf->flags >> 3 & 1;
            uVar11 = *(ushort *)&pMVar7->field_0xa7 >> 7;
            local_7c = uVar11 & 1;
            local_148._0_8_ = (uint8_t *)0x0;
            local_78 = (0x120U >> ((byte)local_a4 & 0x1f)) * -0x400 + 0x1000;
            local_74 = (0x120U >> ((byte)local_a8 & 0x1f)) * -0x400 + 0x1000;
            local_e8 = &av1_intrabc_filter_params;
            local_e0 = &av1_intrabc_filter_params;
            if ((uVar11 & 1) == 0) {
              uVar23 = (ulong)(uVar6 >> 0xc & 0xff0);
              pIVar24 = (InterpFilterParams *)
                        ((long)&av1_interp_filter_params_list[0].filter_ptr + uVar23);
              local_e8 = (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar23);
              if ((char)(uVar6 >> 0x10) == '\x04') {
                local_e8 = pIVar24;
              }
              if (4 < local_d8) {
                local_e8 = pIVar24;
              }
              uVar23 = (ulong)((uVar6 & 0xff) << 4);
              pIVar24 = (InterpFilterParams *)
                        ((long)&av1_interp_filter_params_list[0].filter_ptr + uVar23);
              local_e0 = (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar23);
              if ((char)uVar6 == '\x04') {
                local_e0 = pIVar24;
              }
              if (4 < uVar27) {
                local_e0 = pIVar24;
              }
            }
            local_a0 = local_40 + cm->remapped_ref_idx[(byte)pMVar9->ref_frame[0] - 1];
            local_c8 = (uint8_t *)0x0;
            iStack_b4 = (pRVar10->buf).field_3.field_0.uv_crop_height;
            local_b8 = (pRVar10->buf).field_2.field_0.uv_crop_width;
            iStack_b0 = (pRVar10->buf).field_4.field_0.uv_stride;
            local_100 = 0x15 - local_98;
            if ('\0' < cVar15) {
              local_100 = 7;
            }
            local_104 = local_98 + -7;
            if (local_98 < 0xb) {
              local_104 = 3;
            }
            local_118 = 0;
            local_110 = (CONV_BUF_TYPE *)0x0;
            local_108 = 0;
            if (local_98 < 0xb) {
              local_100 = (uint)(cVar15 < '\x01') * 4 + 7;
            }
            local_f4 = 0;
            local_fc = plane;
            local_f8 = (uint)('\0' < cVar15);
            local_d4 = uVar27;
            local_d0 = iVar14 + uVar19;
            build_one_inter_predictor
                      (pmVar13[lVar31].dst.buf + uVar30 + (long)(int)(uVar19 * dst_stride),
                       dst_stride,(MV *)(ulong)pMVar9->mv[0].as_int,
                       (InterPredParams *)(ulong)(pMVar9->mv[0].as_int >> 0x10));
            uVar30 = uVar30 + (bVar1 >> bVar33);
            lVar21 = lVar21 + 1;
          } while (uVar30 < local_50);
          iVar16 = iVar16 + 1;
          uVar19 = uVar19 + uVar27;
        } while (uVar19 < bVar2);
      }
      pMVar7 = *xd->mi;
      if (((('\0' < pMVar7->ref_frame[0]) && (pMVar7->ref_frame[1] == '\0')) &&
          (0xf8 < (byte)(pMVar7->bsize - BLOCK_32X64))) && (0xfb < (byte)(pMVar7->mode - 0x11))) {
        local_148._0_8_ = xd->plane[0].dst.buf;
        local_148._8_8_ = xd->plane[1].dst.buf;
        local_138 = xd->plane[2].dst.buf;
        local_130 = xd->plane[0].dst.stride;
        local_12c = xd->plane[1].dst.stride;
        local_128 = xd->plane[2].dst.stride;
        if (local_170 == (BUFFER_SET *)0x0) {
          local_170 = (BUFFER_SET *)local_148;
        }
        av1_build_interintra_predictor
                  (cm,xd,pmVar13[lVar31].dst.buf,pmVar13[lVar31].dst.stride,local_170,plane,bsize);
      }
      lVar31 = lVar31 + 1;
      lVar29 = lVar29 + 0xa30;
    } while (plane_to + 1 != (int)lVar31);
  }
  return;
}

Assistant:

void av1_enc_build_inter_predictor(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                   int mi_row, int mi_col,
                                   const BUFFER_SET *ctx, BLOCK_SIZE bsize,
                                   int plane_from, int plane_to) {
  for (int plane = plane_from; plane <= plane_to; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    const int mi_x = mi_col * MI_SIZE;
    const int mi_y = mi_row * MI_SIZE;
    enc_build_inter_predictors(cm, xd, plane, xd->mi[0], xd->plane[plane].width,
                               xd->plane[plane].height, mi_x, mi_y);

    if (is_interintra_pred(xd->mi[0])) {
      BUFFER_SET default_ctx = {
        { xd->plane[0].dst.buf, xd->plane[1].dst.buf, xd->plane[2].dst.buf },
        { xd->plane[0].dst.stride, xd->plane[1].dst.stride,
          xd->plane[2].dst.stride }
      };
      if (!ctx) {
        ctx = &default_ctx;
      }
      av1_build_interintra_predictor(cm, xd, xd->plane[plane].dst.buf,
                                     xd->plane[plane].dst.stride, ctx, plane,
                                     bsize);
    }
  }
}